

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O3

void __thiscall
QHttpThreadDelegate::synchronousFinishedWithErrorSlot
          (QHttpThreadDelegate *this,NetworkError errorCode,QString *detail)

{
  qsizetype *pqVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    *(NetworkError *)(this + 0xf0) = errorCode;
    QString::operator=((QString *)(this + 0xf8),(QString *)detail);
    QHttpNetworkReply::readAll(&local_38,*(QHttpNetworkReply **)(this + 0x150));
    pQVar2 = *(QArrayData **)(this + 0x98);
    pcVar3 = *(char **)(this + 0xa0);
    *(Data **)(this + 0x98) = local_38.d.d;
    *(char **)(this + 0xa0) = local_38.d.ptr;
    qVar4 = *(qsizetype *)(this + 0xa8);
    *(qsizetype *)(this + 0xa8) = local_38.d.size;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_38.d.d = (Data *)pQVar2;
        local_38.d.ptr = pcVar3;
        local_38.d.size = qVar4;
        QArrayData::deallocate(pQVar2,1,0x10);
      }
    }
    pqVar1 = &local_38.d.size;
    local_38.d.size = 0;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)(this + 0x150),"deleteLater",QueuedConnection,1,(void **)&local_38,
               &local_38.d.ptr,(QMetaTypeInterface **)pqVar1);
    local_38.d.size = 0;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)(this + 0x158),"quit",QueuedConnection,1,(void **)&local_38,
               &local_38.d.ptr,(QMetaTypeInterface **)pqVar1);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::synchronousFinishedWithErrorSlot(QNetworkReply::NetworkError errorCode, const QString &detail)
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousFinishedWithErrorSlot() thread=" << QThread::currentThreadId() << "error=" << errorCode << detail;
#endif
    incomingErrorCode = errorCode;
    incomingErrorDetail = detail;

    synchronousDownloadData = httpReply->readAll();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    httpReply = nullptr;
}